

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
     throw_allocation_size_error(void)

{
  length_error *this;
  
  this = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this,"The required allocation exceeds the maximum size.");
  __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void
      throw_allocation_size_error (void)
      {
#ifdef GCH_EXCEPTIONS
        throw std::length_error ("The required allocation exceeds the maximum size.");
#else
        std::fprintf (
          stderr,
          "[gch::small_vector] The required allocation exceeds the maximum size.\n");
        std::abort ();
#endif
      }